

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

void __thiscall
dap::BasicTypeInfo<dap::optional<dap::ExceptionDetails>_>::construct
          (BasicTypeInfo<dap::optional<dap::ExceptionDetails>_> *this,void *ptr)

{
  memset(ptr,0,0xf0);
  *(long *)ptr = (long)ptr + 0x10;
  *(undefined8 *)((long)ptr + 8) = 0;
  *(undefined1 *)((long)ptr + 0x10) = 0;
  *(undefined1 *)((long)ptr + 0x20) = 0;
  *(undefined8 *)((long)ptr + 0x28) = 0;
  *(undefined8 *)((long)ptr + 0x30) = 0;
  *(undefined8 *)((long)ptr + 0x38) = 0;
  *(undefined8 *)((long)ptr + 0x40) = 0;
  *(undefined8 *)((long)ptr + 0x48) = 0;
  *(long *)((long)ptr + 0x28) = (long)ptr + 0x38;
  *(undefined8 *)((long)ptr + 0x30) = 0;
  *(undefined1 *)((long)ptr + 0x38) = 0;
  *(undefined1 *)((long)ptr + 0x48) = 0;
  *(undefined8 *)((long)ptr + 0x70) = 0;
  *(undefined8 *)((long)ptr + 0x78) = 0;
  *(undefined8 *)((long)ptr + 0x80) = 0;
  *(undefined8 *)((long)ptr + 0x88) = 0;
  *(undefined8 *)((long)ptr + 0x90) = 0;
  *(undefined8 *)((long)ptr + 0x50) = 0;
  *(undefined8 *)((long)ptr + 0x58) = 0;
  *(undefined8 *)((long)ptr + 0x60) = 0;
  *(undefined8 *)((long)ptr + 0x68) = 0;
  *(long *)((long)ptr + 0x70) = (long)ptr + 0x80;
  *(undefined8 *)((long)ptr + 0x78) = 0;
  *(undefined1 *)((long)ptr + 0x80) = 0;
  *(undefined1 *)((long)ptr + 0x90) = 0;
  *(undefined8 *)((long)ptr + 0xb8) = 0;
  *(undefined8 *)((long)ptr + 0xa8) = 0;
  *(undefined8 *)((long)ptr + 0xb0) = 0;
  *(undefined8 *)((long)ptr + 0x98) = 0;
  *(undefined8 *)((long)ptr + 0xa0) = 0;
  *(long *)((long)ptr + 0x98) = (long)ptr + 0xa8;
  *(undefined8 *)((long)ptr + 0xa0) = 0;
  *(undefined1 *)((long)ptr + 0xa8) = 0;
  *(undefined1 *)((long)ptr + 0xb8) = 0;
  *(undefined8 *)((long)ptr + 0xe0) = 0;
  *(undefined8 *)((long)ptr + 0xd0) = 0;
  *(undefined8 *)((long)ptr + 0xd8) = 0;
  *(undefined8 *)((long)ptr + 0xc0) = 0;
  *(undefined8 *)((long)ptr + 200) = 0;
  *(long *)((long)ptr + 0xc0) = (long)ptr + 0xd0;
  *(undefined8 *)((long)ptr + 200) = 0;
  *(undefined1 *)((long)ptr + 0xd0) = 0;
  *(undefined1 *)((long)ptr + 0xe0) = 0;
  *(undefined1 *)((long)ptr + 0xe8) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }